

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

int __thiscall QMetaStringTable::enter(QMetaStringTable *this,QByteArray *value)

{
  long lVar1;
  bool bVar2;
  int *piVar3;
  iterator *in_RDI;
  long in_FS_OFFSET;
  int pos;
  iterator it;
  QByteArray *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QByteArray,_int>::find
            ((QHash<QByteArray,_int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
             ,in_stack_ffffffffffffff98);
  QHash<QByteArray,_int>::end((QHash<QByteArray,_int> *)in_RDI);
  bVar2 = QHash<QByteArray,_int>::iterator::operator!=
                    (in_RDI,(iterator *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar2) {
    piVar3 = QHash<QByteArray,_int>::iterator::value((iterator *)0x374e59);
    local_30 = *piVar3;
  }
  else {
    local_30 = (int)(in_RDI->i).bucket;
    QHash<QByteArray,_int>::insert
              ((QHash<QByteArray,_int> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff98,(int *)0x374e7c);
    *(int *)&(in_RDI->i).bucket = (int)(in_RDI->i).bucket + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

int QMetaStringTable::enter(const QByteArray &value)
{
    Entries::iterator it = m_entries.find(value);
    if (it != m_entries.end())
        return it.value();
    int pos = m_index;
    m_entries.insert(value, pos);
    ++m_index;
    return pos;
}